

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O3

bool __thiscall ON_3dmPageSettings::IsValid(ON_3dmPageSettings *this,ON_TextLog *text_log)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  
  dVar1 = this->m_width_mm;
  if ((((dVar1 != 0.0) || (NAN(dVar1))) || (this->m_height_mm != 0.0)) || (NAN(this->m_height_mm)))
  {
    bVar9 = ON_IsValid(dVar1);
    bVar15 = 0.0 < this->m_width_mm;
    if (text_log != (ON_TextLog *)0x0 && (!bVar15 || !bVar9)) {
      ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_width_mm = %g (should be > 0.0).\n");
    }
    bVar10 = ON_IsValid(this->m_height_mm);
    dVar1 = this->m_height_mm;
    bVar5 = 0.0 >= dVar1;
    if (text_log != (ON_TextLog *)0x0 && (bVar5 || !bVar10)) {
      ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_height_mm = %g (should be > 0.0).\n");
    }
    bVar11 = ON_IsValid(this->m_top_margin_mm);
    dVar2 = this->m_top_margin_mm;
    bVar6 = 0.0 > dVar2;
    if (text_log != (ON_TextLog *)0x0 && (bVar6 || !bVar11)) {
      ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_top_margin_mm = %g (should be >= 0.0).\n"
                       );
    }
    bVar12 = ON_IsValid(this->m_bottom_margin_mm);
    dVar3 = this->m_bottom_margin_mm;
    bVar7 = 0.0 > dVar3;
    if (text_log != (ON_TextLog *)0x0 && (bVar7 || !bVar12)) {
      ON_TextLog::Print(text_log,
                        "ON_3dmPageSettings has m_bottom_margin_mm = %g (should be >= 0.0).\n");
    }
    bVar13 = ON_IsValid(this->m_left_margin_mm);
    dVar4 = this->m_left_margin_mm;
    bVar8 = 0.0 > dVar4;
    if (text_log != (ON_TextLog *)0x0 && (bVar8 || !bVar13)) {
      ON_TextLog::Print(text_log,
                        "ON_3dmPageSettings has m_left_margin_mm = %g (should be >= 0.0).\n");
    }
    bVar14 = ON_IsValid(this->m_right_margin_mm);
    if ((!bVar14) || (this->m_right_margin_mm < 0.0)) {
      if ((text_log != (ON_TextLog *)0x0) &&
         (ON_TextLog::Print(text_log,
                            "ON_3dmPageSettings has m_right_margin_mm = %g (should be >= 0.0).\n"),
         this->m_width_mm <= this->m_left_margin_mm + this->m_right_margin_mm)) goto LAB_003770e1;
    }
    else {
      bVar14 = this->m_right_margin_mm + this->m_left_margin_mm < this->m_width_mm;
      if (text_log == (ON_TextLog *)0x0 || bVar14) {
        bVar14 = bVar14 && ((text_log == (ON_TextLog *)0x0 || (NAN(dVar4) || !bVar8) && bVar13) &&
                           ((0.0 <= dVar4 && bVar13) &&
                           ((text_log == (ON_TextLog *)0x0 || (NAN(dVar3) || !bVar7) && bVar12) &&
                           ((0.0 <= dVar3 && bVar12) &&
                           ((text_log == (ON_TextLog *)0x0 || (NAN(dVar2) || !bVar6) && bVar11) &&
                           ((0.0 <= dVar2 && bVar11) &&
                           ((text_log == (ON_TextLog *)0x0 || (NAN(dVar1) || !bVar5) && bVar10) &&
                           ((0.0 < dVar1 && bVar10) && (bVar15 && bVar9)))))))));
        goto LAB_003770f4;
      }
LAB_003770e1:
      ON_TextLog::Print(text_log,
                        "ON_3dmPageSettings has m_left_margin_mm+m_right_margin_mm = %g > %g = m_width_mm.\n"
                       );
    }
    bVar14 = false;
LAB_003770f4:
    bVar15 = this->m_top_margin_mm + this->m_bottom_margin_mm < this->m_height_mm;
    if (text_log != (ON_TextLog *)0x0 && !bVar15) {
      ON_TextLog::Print(text_log,
                        "ON_3dmPageSettings has m_top_margin_mm+m_bottom_margin_mm = %g > %g = m_height_mm.\n"
                       );
      return false;
    }
    return (bool)(bVar15 & bVar14);
  }
  dVar1 = this->m_top_margin_mm;
  if ((text_log != (ON_TextLog *)0x0) && ((dVar1 != 0.0 || (NAN(dVar1))))) {
    ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_top_margin_mm = %g (should be 0.0).\n",
                      dVar1);
  }
  if ((this->m_bottom_margin_mm != 0.0) || (NAN(this->m_bottom_margin_mm))) {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_bottom_margin_mm = %g (should be 0.0).\n");
    if ((this->m_left_margin_mm != 0.0) || (NAN(this->m_left_margin_mm))) goto LAB_00377161;
  }
  else {
    bVar15 = this->m_left_margin_mm == 0.0;
    if (text_log == (ON_TextLog *)0x0 || bVar15) {
      bVar15 = dVar1 == 0.0 && bVar15;
      goto LAB_00377174;
    }
LAB_00377161:
    ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_left_margin_mm = %g (should be 0.0).\n");
  }
  bVar15 = false;
LAB_00377174:
  bVar9 = this->m_right_margin_mm == 0.0;
  if (text_log != (ON_TextLog *)0x0 && !bVar9) {
    ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_right_margin_mm = %g (should be 0.0).\n");
    return false;
  }
  return (bool)(bVar15 & bVar9);
}

Assistant:

bool ON_3dmPageSettings::IsValid( ON_TextLog* text_log ) const
{
  bool rc = true;

  if ( m_width_mm != 0.0 || m_height_mm != 0.0 )
  {
    if ( !ON_IsValid(m_width_mm) || m_width_mm <= 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_width_mm = %g (should be > 0.0).\n",m_width_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_height_mm) || m_height_mm <= 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_height_mm = %g (should be > 0.0).\n",m_height_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_top_margin_mm) || m_top_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_top_margin_mm = %g (should be >= 0.0).\n",m_top_margin_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_bottom_margin_mm) || m_bottom_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_bottom_margin_mm = %g (should be >= 0.0).\n",m_bottom_margin_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_left_margin_mm) || m_left_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_left_margin_mm = %g (should be >= 0.0).\n",m_left_margin_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_right_margin_mm) || m_right_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_right_margin_mm = %g (should be >= 0.0).\n",m_right_margin_mm);
      }
      rc = false;
    }
    if ( m_left_margin_mm + m_right_margin_mm >= m_width_mm )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_left_margin_mm+m_right_margin_mm = %g > %g = m_width_mm.\n",m_left_margin_mm + m_right_margin_mm, m_width_mm);
      }
      rc = false;
    }
    if ( m_top_margin_mm + m_bottom_margin_mm >= m_height_mm )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_top_margin_mm+m_bottom_margin_mm = %g > %g = m_height_mm.\n",m_top_margin_mm + m_bottom_margin_mm, m_height_mm);
      }
      rc = false;
    }
  }
  else
  {
    if ( m_top_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_top_margin_mm = %g (should be 0.0).\n",m_top_margin_mm);
      }
      rc = false;
    }
    if ( m_bottom_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_bottom_margin_mm = %g (should be 0.0).\n",m_bottom_margin_mm);
      }
      rc = false;
    }
    if ( m_left_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_left_margin_mm = %g (should be 0.0).\n",m_left_margin_mm);
      }
      rc = false;
    }
    if ( m_right_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_right_margin_mm = %g (should be 0.0).\n",m_right_margin_mm);
      }
      rc = false;
    }
  }

  return rc;
}